

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::endBitSetScalar(Input *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  ulong uVar4;
  reference this_00;
  pointer hnode;
  Twine local_48;
  reference local_30;
  uint local_1c;
  ret_type pSStack_18;
  uint i;
  SequenceHNode *SQ;
  Input *this_local;
  
  SQ = (SequenceHNode *)this;
  bVar1 = std::error_code::operator_cast_to_bool(&this->EC);
  if ((!bVar1) &&
     (pSStack_18 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>
                             (this->CurrentNode), pSStack_18 != (ret_type)0x0)) {
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(&this->BitValuesUsed);
    sVar3 = std::
            vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
            ::size(&pSStack_18->Entries);
    if (sVar2 != sVar3) {
      __assert_fail("BitValuesUsed.size() == SQ->Entries.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                    ,0x147,"virtual void llvm::yaml::Input::endBitSetScalar()");
    }
    for (local_1c = 0; uVar4 = (ulong)local_1c,
        sVar2 = std::
                vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                ::size(&pSStack_18->Entries), uVar4 < sVar2; local_1c = local_1c + 1) {
      local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->BitValuesUsed,(ulong)local_1c);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_30);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_00 = std::
                  vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                  ::operator[](&pSStack_18->Entries,(ulong)local_1c);
        hnode = std::
                unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                ::get(this_00);
        Twine::Twine(&local_48,"unknown bit value");
        setError(this,hnode,&local_48);
        return;
      }
    }
  }
  return;
}

Assistant:

void Input::endBitSetScalar() {
  if (EC)
    return;
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    assert(BitValuesUsed.size() == SQ->Entries.size());
    for (unsigned i = 0; i < SQ->Entries.size(); ++i) {
      if (!BitValuesUsed[i]) {
        setError(SQ->Entries[i].get(), "unknown bit value");
        return;
      }
    }
  }
}